

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl4cComputeShaderTests.cpp
# Opt level: O1

bool __thiscall
gl4cts::anon_unknown_0::BasicSharedStruct::RunIteration
          (BasicSharedStruct *this,bool dispatch_indirect)

{
  CallLogWrapper *this_00;
  float fVar1;
  float fVar2;
  float fVar3;
  float fVar4;
  void *__s;
  long lVar5;
  int i;
  long lVar6;
  uint uVar7;
  bool bVar8;
  GLuint groups [3];
  float local_50 [4];
  undefined1 *local_40;
  undefined4 local_38;
  
  __s = operator_new(0x1000);
  memset(__s,0,0x1000);
  if (this->m_storage_buffer == 0) {
    glu::CallLogWrapper::glGenBuffers
              (&(this->super_ComputeShaderBase).super_SubcaseBase.super_GLWrapper.
                super_CallLogWrapper,1,&this->m_storage_buffer);
  }
  this_00 = &(this->super_ComputeShaderBase).super_SubcaseBase.super_GLWrapper.super_CallLogWrapper;
  glu::CallLogWrapper::glBindBufferBase(this_00,0x90d2,0,this->m_storage_buffer);
  glu::CallLogWrapper::glBufferData(this_00,0x90d2,0x1000,__s,0x88e8);
  glu::CallLogWrapper::glBindBuffer(this_00,0x90d2,0);
  glu::CallLogWrapper::glUseProgram(this_00,this->m_program);
  if (dispatch_indirect) {
    local_40 = &DAT_100000001;
    local_38 = 1;
    if (this->m_dispatch_buffer == 0) {
      glu::CallLogWrapper::glGenBuffers(this_00,1,&this->m_dispatch_buffer);
    }
    glu::CallLogWrapper::glBindBuffer(this_00,0x90ee,this->m_dispatch_buffer);
    glu::CallLogWrapper::glBufferData(this_00,0x90ee,0xc,&local_40,0x88e4);
    glu::CallLogWrapper::glDispatchComputeIndirect(this_00,0);
  }
  else {
    glu::CallLogWrapper::glDispatchCompute(this_00,1,1,1);
  }
  glu::CallLogWrapper::glBindBuffer(this_00,0x90d2,this->m_storage_buffer);
  glu::CallLogWrapper::glMemoryBarrier(this_00,0x200);
  uVar7 = 0;
  glu::CallLogWrapper::glGetBufferSubData(this_00,0x90d2,0,0x1000,__s);
  lVar5 = 0;
  bVar8 = false;
  while( true ) {
    lVar6 = lVar5 * 0x10;
    fVar1 = *(float *)((long)__s + lVar6);
    fVar2 = *(float *)((long)__s + lVar6 + 4);
    fVar3 = *(float *)((long)__s + lVar6 + 8);
    fVar4 = *(float *)((long)__s + lVar6 + 0xc);
    lVar6 = 0;
    do {
      local_50[lVar6] = (float)(int)uVar7;
      lVar6 = lVar6 + 1;
    } while (lVar6 != 4);
    if (((((fVar1 != local_50[0]) || (NAN(fVar1) || NAN(local_50[0]))) || (fVar2 != local_50[1])) ||
        ((NAN(fVar2) || NAN(local_50[1]) || (fVar3 != local_50[2])))) ||
       ((NAN(fVar3) || NAN(local_50[2]) ||
        ((fVar4 != local_50[3] || (NAN(fVar4) || NAN(local_50[3]))))))) break;
    bVar8 = 0xfe < uVar7;
    uVar7 = uVar7 + 1;
    lVar5 = lVar5 + 1;
    if (lVar5 == 0x100) {
LAB_009266b7:
      operator_delete(__s,0x1000);
      return bVar8;
    }
  }
  anon_unknown_0::Output("Invalid data at index %d.\n",(ulong)uVar7);
  goto LAB_009266b7;
}

Assistant:

bool RunIteration(bool dispatch_indirect)
	{
		const GLuint kBufferSize = 256;

		std::vector<vec4> data(kBufferSize);
		if (m_storage_buffer == 0)
			glGenBuffers(1, &m_storage_buffer);
		glBindBufferBase(GL_SHADER_STORAGE_BUFFER, 0, m_storage_buffer);
		glBufferData(GL_SHADER_STORAGE_BUFFER, sizeof(vec4) * kBufferSize, &data[0], GL_DYNAMIC_DRAW);
		glBindBuffer(GL_SHADER_STORAGE_BUFFER, 0);

		glUseProgram(m_program);
		if (dispatch_indirect)
		{
			const GLuint groups[3] = { 1, 1, 1 };
			if (m_dispatch_buffer == 0)
				glGenBuffers(1, &m_dispatch_buffer);
			glBindBuffer(GL_DISPATCH_INDIRECT_BUFFER, m_dispatch_buffer);
			glBufferData(GL_DISPATCH_INDIRECT_BUFFER, sizeof(groups), groups, GL_STATIC_DRAW);
			glDispatchComputeIndirect(0);
		}
		else
		{
			glDispatchCompute(1, 1, 1);
		}

		glBindBuffer(GL_SHADER_STORAGE_BUFFER, m_storage_buffer);
		glMemoryBarrier(GL_BUFFER_UPDATE_BARRIER_BIT);
		glGetBufferSubData(GL_SHADER_STORAGE_BUFFER, 0, sizeof(vec4) * kBufferSize, &data[0]);
		for (GLuint i = 0; i < kBufferSize; ++i)
		{
			if (!IsEqual(data[i], vec4(static_cast<float>(i))))
			{
				Output("Invalid data at index %d.\n", i);
				return false;
			}
		}
		return true;
	}